

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O1

void __thiscall
Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::InitializeStaticSRBResources
          (PipelineStateBase<Diligent::EngineGLImplTraits> *this,IShaderResourceBinding *pSRB)

{
  PipelineResourceSignatureImplType *this_00;
  string _msg;
  string local_30;
  
  CheckPipelineReady(this);
  if (this->m_UsingImplicitSignature != false) {
    this_00 = GetResourceSignature(this,0);
    PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::InitializeStaticSRBResources
              (&this_00->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>,pSRB);
    return;
  }
  FormatString<char[183]>
            (&local_30,
             (char (*) [183])
             "IPipelineState::InitializeStaticSRBResources is not allowed for pipelines that use explicit resource signatures. Use IPipelineResourceSignature::InitializeStaticSRBResources instead."
            );
  if (DebugMessageCallback != (undefined *)0x0) {
    (*(code *)DebugMessageCallback)(2,local_30._M_dataplus._M_p,0,0,0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

InitializeStaticSRBResources(IShaderResourceBinding* pSRB) const override final
    {
        CheckPipelineReady();

        if (!m_UsingImplicitSignature)
        {
            LOG_ERROR_MESSAGE("IPipelineState::InitializeStaticSRBResources is not allowed for pipelines that use explicit "
                              "resource signatures. Use IPipelineResourceSignature::InitializeStaticSRBResources instead.");
            return;
        }

        return this->GetResourceSignature(0)->InitializeStaticSRBResources(pSRB);
    }